

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_solveRealLPAndRecordStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool *interrupt)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Representation RVar6;
  Statistics *pSVar7;
  undefined1 this_01 [8];
  type_conflict5 tVar8;
  Type TVar9;
  int iVar10;
  Settings *pSVar11;
  int iVar12;
  Verbosity old_verbosity;
  Representation RVar13;
  bool bVar14;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar15;
  Real RVar16;
  double dVar17;
  double local_1b0;
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  uint local_198 [2];
  uint auStack_190 [2];
  uint local_188 [2];
  int local_180;
  bool local_17c;
  undefined8 local_178;
  double local_170;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mintol;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pSVar11 = this->_currentSettings;
  dVar15 = pSVar11->_realParamValues[6];
  if (dVar15 <= (double)pSVar11->_intParamValues[5]) {
    iVar10 = -1;
  }
  else {
    iVar12 = pSVar11->_intParamValues[5] - this->_statistics->iterations;
    iVar10 = -1;
    if (-1 < iVar12) {
      iVar10 = iVar12;
    }
  }
  bVar14 = this->_hasBasis;
  (this->_solver).maxIters = iVar10;
  if (pSVar11->_realParamValues[7] < dVar15) {
    local_170 = pSVar11->_realParamValues[7];
    (*this->_statistics->solvingTime->_vptr_Timer[6])();
    dVar15 = local_170 - extraout_XMM0_Qa;
  }
  RVar16 = 0.0;
  if (0.0 <= dVar15) {
    RVar16 = dVar15;
  }
  (this->_solver).maxTime = RVar16;
  local_1b0 = 10000.0;
  this_00 = &this->_solver;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_1a8,this_00);
  mintol.m_backend.fpclass = cpp_dec_float_finite;
  mintol.m_backend.prec_elem = 10;
  mintol.m_backend.data._M_elems[0] = 0;
  mintol.m_backend.data._M_elems[1] = 0;
  mintol.m_backend.data._M_elems[2] = 0;
  mintol.m_backend.data._M_elems[3] = 0;
  mintol.m_backend.data._M_elems[4] = 0;
  mintol.m_backend.data._M_elems[5] = 0;
  mintol.m_backend.data._M_elems._24_5_ = 0;
  mintol.m_backend.data._M_elems[7]._1_3_ = 0;
  mintol.m_backend.data._M_elems._32_5_ = 0;
  mintol.m_backend._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
            (&mintol.m_backend,(cpp_dec_float<50U,_int,_void> *)local_1a8,&local_1b0);
  psVar1 = &this->_tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_1a8,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  local_1b0 = Tolerances::floatingPointFeastol((Tolerances *)local_1a8);
  tVar8 = boost::multiprecision::operator<(&local_1b0,&mintol);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a0);
  if (tVar8) {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_1a8,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    this_01 = local_1a8;
    dVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                       (&mintol.m_backend);
    Tolerances::setFloatingPointFeastol((Tolerances *)this_01,dVar15);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a0);
  }
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_1a8,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  local_1b0 = Tolerances::floatingPointOpttol((Tolerances *)local_1a8);
  tVar8 = boost::multiprecision::operator<(&local_1b0,&mintol);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a0);
  if (tVar8) {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_1a8,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    dVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                       (&mintol.m_backend);
    Tolerances::setFloatingPointOpttol((Tolerances *)local_1a8,dVar15);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a0);
  }
  iVar10 = this->_currentSettings->_intParamValues[1];
  if (iVar10 == 2) {
    if ((this->_solver).theRep != ROW) {
LAB_002ad0a3:
      RVar13 = ROW;
LAB_002ad0a6:
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setRep(this_00,RVar13);
    }
  }
  else {
    RVar13 = COLUMN;
    if (iVar10 == 1) {
      if ((this->_solver).theRep != COLUMN) goto LAB_002ad0a6;
    }
    else if (iVar10 == 0) {
      dVar15 = (double)((this->_solver).
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum + 1) * this->_currentSettings->_realParamValues[0x10];
      dVar17 = (double)((this->_solver).
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum + 1);
      RVar6 = (this->_solver).theRep;
      if (RVar6 != COLUMN && dVar17 <= dVar15) goto LAB_002ad0a6;
      if (RVar6 != ROW && dVar15 < dVar17) goto LAB_002ad0a3;
    }
  }
  iVar10 = this->_currentSettings->_intParamValues[2];
  if (iVar10 == 1) {
    TVar9 = (this->_solver).theType;
    RVar13 = (this->_solver).theRep;
    if (TVar9 == ENTER || RVar13 != ROW) {
      if (RVar13 != COLUMN) goto LAB_002ad11e;
      goto LAB_002ad10a;
    }
LAB_002ad113:
    TVar9 = ENTER;
  }
  else {
    if (iVar10 != 0) goto LAB_002ad11e;
    TVar9 = (this->_solver).theType;
    RVar13 = (this->_solver).theRep;
    if (TVar9 != ENTER && RVar13 == COLUMN) goto LAB_002ad113;
    if (RVar13 != ROW) goto LAB_002ad11e;
LAB_002ad10a:
    if (TVar9 == LEAVE) goto LAB_002ad11e;
    TVar9 = LEAVE;
  }
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setType(this_00,TVar9);
LAB_002ad11e:
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_68,this->_currentSettings->_realParamValues[0xf],(type *)0x0);
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 8) =
       local_68.data._M_elems._32_8_;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 4) =
       local_68.data._M_elems._16_8_;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 6) =
       local_68.data._M_elems._24_8_;
  *(undefined8 *)(this->_solver).sparsePricingFactor.m_backend.data._M_elems =
       local_68.data._M_elems._0_8_;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 2) =
       local_68.data._M_elems._8_8_;
  (this->_solver).sparsePricingFactor.m_backend.exp = local_68.exp;
  (this->_solver).sparsePricingFactor.m_backend.neg = local_68.neg;
  (this->_solver).sparsePricingFactor.m_backend.fpclass = local_68.fpclass;
  (this->_solver).sparsePricingFactor.m_backend.prec_elem = local_68.prec_elem;
  pSVar11 = this->_currentSettings;
  iVar10 = pSVar11->_intParamValues[0x14];
  if (iVar10 == 0) {
    (this->_solver).hyperPricingLeave = false;
    (this->_solver).hyperPricingEnter = false;
  }
  else if ((iVar10 == 2) ||
          ((iVar10 == 1 &&
           (5000 < (this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum +
                   (this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum)))) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::hyperPricing(this_00,true);
    pSVar11 = this->_currentSettings;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_a0,pSVar11->_realParamValues[0x13],(type *)0x0);
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 8) = local_a0.data._M_elems._32_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 4) = local_a0.data._M_elems._16_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 6) = local_a0.data._M_elems._24_8_;
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .nonzeroFactor.m_backend.data._M_elems = local_a0.data._M_elems._0_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 2) = local_a0.data._M_elems._8_8_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.exp = local_a0.exp;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.neg = local_a0.neg;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.fpclass = local_a0.fpclass;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.prec_elem = local_a0.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_d8,this->_currentSettings->_realParamValues[0x14],(type *)0x0);
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 8) = local_d8.data._M_elems._32_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 4) = local_d8.data._M_elems._16_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 6) = local_d8.data._M_elems._24_8_;
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .fillFactor.m_backend.data._M_elems = local_d8.data._M_elems._0_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 2) = local_d8.data._M_elems._8_8_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.exp = local_d8.exp;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.neg = local_d8.neg;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.fpclass = local_d8.fpclass;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.prec_elem = local_d8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_110,this->_currentSettings->_realParamValues[0x15],(type *)0x0);
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memFactor.m_backend.data._M_elems + 8) = local_110.data._M_elems._32_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memFactor.m_backend.data._M_elems + 4) = local_110.data._M_elems._16_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memFactor.m_backend.data._M_elems + 6) = local_110.data._M_elems._24_8_;
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .memFactor.m_backend.data._M_elems = local_110.data._M_elems._0_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memFactor.m_backend.data._M_elems + 2) = local_110.data._M_elems._8_8_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.exp = local_110.exp;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.neg = local_110.neg;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.fpclass = local_110.fpclass;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.prec_elem = local_110.prec_elem;
  (*this->_statistics->simplexTime->_vptr_Timer[3])();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solve(this_00,interrupt,true);
  (*this->_statistics->simplexTime->_vptr_Timer[4])();
  iVar10 = (this->_solver).
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .iterCount;
  if (0 < iVar10) {
    SLUFactorRational::clear(&this->_rationalLUSolver);
    iVar10 = (this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .iterCount;
  }
  pSVar7 = this->_statistics;
  pSVar7->iterations = pSVar7->iterations + iVar10;
  iVar12 = iVar10;
  if (iVar10 != 0) {
    iVar12 = (this->_solver).primalCount;
  }
  pSVar7->iterationsPrimal = pSVar7->iterationsPrimal + iVar12;
  iVar12 = 0;
  if (bVar14 != false) {
    iVar12 = iVar10;
  }
  pSVar7->iterationsFromBasis = pSVar7->iterationsFromBasis + iVar12;
  pSVar7->iterationsPolish = pSVar7->iterationsPolish + (this->_solver).polishCount;
  pSVar7->boundflips = pSVar7->boundflips + (this->_solver).totalboundflips;
  (*((this->_solver).multTimeSparse)->_vptr_Timer[6])();
  this->_statistics->multTimeSparse = extraout_XMM0_Qa_00 + this->_statistics->multTimeSparse;
  (*((this->_solver).multTimeFull)->_vptr_Timer[6])();
  this->_statistics->multTimeFull = extraout_XMM0_Qa_01 + this->_statistics->multTimeFull;
  (*((this->_solver).multTimeColwise)->_vptr_Timer[6])();
  this->_statistics->multTimeColwise = extraout_XMM0_Qa_02 + this->_statistics->multTimeColwise;
  (*((this->_solver).multTimeUnsetup)->_vptr_Timer[6])();
  pSVar7 = this->_statistics;
  pSVar7->multTimeUnsetup = extraout_XMM0_Qa_03 + pSVar7->multTimeUnsetup;
  uVar2 = (this->_solver).multSparseCalls;
  uVar3 = (this->_solver).multFullCalls;
  uVar4 = (this->_solver).multColwiseCalls;
  uVar5 = (this->_solver).multUnsetupCalls;
  pSVar7->multSparseCalls = pSVar7->multSparseCalls + uVar2;
  pSVar7->multFullCalls = pSVar7->multFullCalls + uVar3;
  pSVar7->multColwiseCalls = pSVar7->multColwiseCalls + uVar4;
  pSVar7->multUnsetupCalls = pSVar7->multUnsetupCalls + uVar5;
  (*((this->_slufactor).
     super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .factorTime)->_vptr_Timer[6])();
  this->_statistics->luFactorizationTimeReal =
       extraout_XMM0_Qa_04 + this->_statistics->luFactorizationTimeReal;
  (*((this->_slufactor).solveTime)->_vptr_Timer[6])();
  pSVar7 = this->_statistics;
  pSVar7->luSolveTimeReal = extraout_XMM0_Qa_05 + pSVar7->luSolveTimeReal;
  pSVar7->luFactorizationsReal =
       pSVar7->luFactorizationsReal +
       (this->_slufactor).
       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .factorCount;
  pSVar7->luSolvesReal = pSVar7->luSolvesReal + (this->_slufactor).solveCount;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::resetCounters(&this->_slufactor);
  bVar14 = (this->_solver).theRep == ROW;
  pSVar7 = this->_statistics;
  pSVar7->degenPivotsPrimal =
       pSVar7->degenPivotsPrimal +
       (this->_solver).primalDegenSum.m_backend.data._M_elems[(ulong)bVar14 - 4];
  pSVar7->degenPivotsDual =
       pSVar7->degenPivotsDual +
       (this->_solver).primalDegenSum.m_backend.data._M_elems[(ulong)!bVar14 - 4];
  local_188 = *(uint (*) [2])((this->_solver).dualDegenSum.m_backend.data._M_elems + 8);
  local_1a8 = *(undefined1 (*) [8])(this->_solver).dualDegenSum.m_backend.data._M_elems;
  _Stack_1a0._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        ((this->_solver).dualDegenSum.m_backend.data._M_elems + 2);
  local_198 = *(uint (*) [2])((this->_solver).dualDegenSum.m_backend.data._M_elems + 4);
  auStack_190 = *(uint (*) [2])((this->_solver).dualDegenSum.m_backend.data._M_elems + 6);
  local_180 = (this->_solver).dualDegenSum.m_backend.exp;
  local_17c = (this->_solver).dualDegenSum.m_backend.neg;
  local_178._0_4_ = (this->_solver).dualDegenSum.m_backend.fpclass;
  local_178._4_4_ = (this->_solver).dualDegenSum.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(pSVar7->sumDualDegen).m_backend,(cpp_dec_float<50U,_int,_void> *)local_1a8);
  local_188 = *(uint (*) [2])((this->_solver).primalDegenSum.m_backend.data._M_elems + 8);
  local_1a8 = *(undefined1 (*) [8])(this->_solver).primalDegenSum.m_backend.data._M_elems;
  _Stack_1a0._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        ((this->_solver).primalDegenSum.m_backend.data._M_elems + 2);
  local_198 = *(uint (*) [2])((this->_solver).primalDegenSum.m_backend.data._M_elems + 4);
  auStack_190 = *(uint (*) [2])((this->_solver).primalDegenSum.m_backend.data._M_elems + 6);
  local_180 = (this->_solver).primalDegenSum.m_backend.exp;
  local_17c = (this->_solver).primalDegenSum.m_backend.neg;
  local_178._0_4_ = (this->_solver).primalDegenSum.m_backend.fpclass;
  local_178._4_4_ = (this->_solver).primalDegenSum.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(this->_statistics->sumPrimalDegen).m_backend,
             (cpp_dec_float<50U,_int,_void> *)local_1a8);
  return;
}

Assistant:

void SoPlexBase<R>::_solveRealLPAndRecordStatistics(volatile bool* interrupt)
{
   bool _hadBasis = _hasBasis;

   // set time and iteration limit
   if(intParam(SoPlexBase<R>::ITERLIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationIter(intParam(SoPlexBase<R>::ITERLIMIT) - _statistics->iterations);
   else
      _solver.setTerminationIter(-1);

   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                 _statistics->solvingTime->time());
   else
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::INFTY)));

   // ensure that tolerances are not too small
   R mintol = 1e4 * _solver.epsilon();

   if(this->tolerances()->floatingPointFeastol() < mintol)
      this->tolerances()->setFloatingPointFeastol(Real(mintol));

   if(this->tolerances()->floatingPointOpttol() < mintol)
      this->tolerances()->setFloatingPointOpttol(Real(mintol));

   // set correct representation
   if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_COLUMN
         || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
             && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) >=
             (_solver.nRows() + 1)))
         && _solver.rep() != SPxSolverBase<R>::COLUMN)
   {
      _solver.setRep(SPxSolverBase<R>::COLUMN);
   }
   else if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
           && _solver.rep() != SPxSolverBase<R>::ROW)
   {
      _solver.setRep(SPxSolverBase<R>::ROW);
   }

   // set correct type
   if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
         && _solver.rep() == SPxSolverBase<R>::COLUMN)
         || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL && _solver.rep() == SPxSolverBase<R>::ROW))
         && _solver.type() != SPxSolverBase<R>::ENTER)
   {
      _solver.setType(SPxSolverBase<R>::ENTER);
   }
   else if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL
             && _solver.rep() == SPxSolverBase<R>::COLUMN)
            || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
                && _solver.rep() == SPxSolverBase<R>::ROW))
           && _solver.type() != SPxSolverBase<R>::LEAVE)
   {
      _solver.setType(SPxSolverBase<R>::LEAVE);
   }

   // set pricing modes
   _solver.setSparsePricingFactor(realParam(SoPlexBase<R>::SPARSITY_THRESHOLD));

   if((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_ON)
         || ((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_AUTO)
             && (_solver.nRows() + _solver.nCols() > SOPLEX_HYPERPRICINGTHRESHOLD)))
      _solver.hyperPricing(true);
   else if(intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_OFF)
      _solver.hyperPricing(false);

   _solver.setNonzeroFactor(realParam(SoPlexBase<R>::REFAC_BASIS_NNZ));
   _solver.setFillFactor(realParam(SoPlexBase<R>::REFAC_UPDATE_FILL));
   _solver.setMemFactor(realParam(SoPlexBase<R>::REFAC_MEM_FACTOR));

   // call floating-point solver and catch exceptions
   _statistics->simplexTime->start();

   try
   {
      _solver.solve(interrupt);
   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() << "> while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught unknown exception while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }

   _statistics->simplexTime->stop();

   // invalidate rational factorization of basis if pivots have been performed
   if(_solver.iterations() > 0)
      _rationalLUSolver.clear();

   // record statistics
   _statistics->iterations += _solver.iterations();
   _statistics->iterationsPrimal += _solver.primalIterations();
   _statistics->iterationsFromBasis += _hadBasis ? _solver.iterations() : 0;
   _statistics->iterationsPolish += _solver.polishIterations();
   _statistics->boundflips += _solver.boundFlips();
   _statistics->multTimeSparse += _solver.multTimeSparse->time();
   _statistics->multTimeFull += _solver.multTimeFull->time();
   _statistics->multTimeColwise += _solver.multTimeColwise->time();
   _statistics->multTimeUnsetup += _solver.multTimeUnsetup->time();
   _statistics->multSparseCalls += _solver.multSparseCalls;
   _statistics->multFullCalls += _solver.multFullCalls;
   _statistics->multColwiseCalls += _solver.multColwiseCalls;
   _statistics->multUnsetupCalls += _solver.multUnsetupCalls;
   _statistics->luFactorizationTimeReal += _slufactor.getFactorTime();
   _statistics->luSolveTimeReal += _slufactor.getSolveTime();
   _statistics->luFactorizationsReal += _slufactor.getFactorCount();
   _statistics->luSolvesReal += _slufactor.getSolveCount();
   _slufactor.resetCounters();

   _statistics->degenPivotsPrimal += _solver.primalDegeneratePivots();
   _statistics->degenPivotsDual += _solver.dualDegeneratePivots();
   _statistics->sumDualDegen += _solver.sumDualDegeneracy();
   _statistics->sumPrimalDegen += _solver.sumPrimalDegeneracy();
}